

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetCMakePropertyCommand.h
# Opt level: O0

cmCommand * __thiscall cmGetCMakePropertyCommand::Clone(cmGetCMakePropertyCommand *this)

{
  cmCommand *this_00;
  cmGetCMakePropertyCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmGetCMakePropertyCommand((cmGetCMakePropertyCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmGetCMakePropertyCommand; }